

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJWriter.cc
# Opt level: O0

size_t __thiscall OpenMesh::IO::_OBJWriter_::getMaterial(_OBJWriter_ *this,Vec4f _color)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  ulong local_38;
  size_t i;
  _OBJWriter_ *this_local;
  Vec4f _color_local;
  
  _color_local.super_VectorDataT<float,_4>.field_0._0_8_ =
       _color.super_VectorDataT<float,_4>.field_0._8_8_;
  this_local = _color.super_VectorDataT<float,_4>.field_0._0_8_;
  local_38 = 0;
  while( true ) {
    sVar2 = std::vector<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
            ::size(&this->materialA_);
    if (sVar2 <= local_38) {
      std::vector<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>::
      push_back(&this->materialA_,(value_type *)&this_local);
      sVar2 = std::
              vector<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>::
              size(&this->materialA_);
      return sVar2 - 1;
    }
    this_00 = std::
              vector<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>::
              operator[](&this->materialA_,local_38);
    bVar1 = VectorT<float,_4>::operator==(this_00,(vector_type *)&this_local);
    if (bVar1) break;
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

size_t _OBJWriter_::getMaterial(OpenMesh::Vec4f _color) const
{
  for (size_t i=0; i < materialA_.size(); i++)
    if(materialA_[i] == _color)
      return i;

  //not found add new material
  materialA_.push_back( _color );
  return materialA_.size()-1;
}